

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::setMaxCount(Picker *this,int max)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QModelIndex local_48;
  char *local_30;
  
  if (max < 0) {
    local_48.r = 2;
    local_48.m._4_4_ = 0;
    local_48._4_8_ = 0;
    local_48._12_8_ = 0;
    local_30 = "default";
    QMessageLogger::warning
              ((char *)&local_48,"QtMWidgets::Picker::setMaxCount: Invalid count (%d) must be >= 0",
               max);
  }
  else {
    iVar2 = count(this);
    if (max < iVar2) {
      pQVar1 = ((this->d).d)->model;
      iVar2 = count(this);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&((this->d).d)->root);
      (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,max,iVar2 - max,&local_48);
    }
    ((this->d).d)->maxCount = max;
  }
  return;
}

Assistant:

void
Picker::setMaxCount( int max )
{
	if( max < 0 )
	{
		qWarning( "QtMWidgets::Picker::setMaxCount: Invalid count (%d) must be >= 0",
			max );
		return;
	}

	if( max < count() )
		d->model->removeRows( max, count() - max, d->root );

	d->maxCount = max;
}